

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O0

void Curl_cpool_destroy(cpool *cpool)

{
  char *pcVar1;
  undefined1 local_b8 [8];
  sigpipe_ignore pipe_st;
  connectdata *conn;
  cpool *cpool_local;
  
  if (((cpool != (cpool *)0x0) && (((byte)cpool->field_0x68 >> 1 & 1) != 0)) &&
     (cpool->idata != (Curl_easy *)0x0)) {
    if ((((cpool->idata != (Curl_easy *)0x0) &&
         ((*(ulong *)&(cpool->idata->set).field_0x89c >> 0x1e & 1) != 0)) &&
        (((cpool->idata->state).feat == (curl_trc_feat *)0x0 ||
         (0 < ((cpool->idata->state).feat)->log_level)))) && (0 < Curl_trc_feat_multi.log_level)) {
      pcVar1 = "";
      if (cpool->share != (Curl_share *)0x0) {
        pcVar1 = "[SHARE] ";
      }
      Curl_trc_multi(cpool->idata,"%s[CPOOL] destroy, %zu connections",pcVar1);
    }
    sigpipe_init((sigpipe_ignore *)local_b8);
    if (cpool != (cpool *)0x0) {
      if ((cpool->share != (Curl_share *)0x0) && ((cpool->share->specifier & 0x20) != 0)) {
        Curl_share_lock(cpool->idata,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
      }
      cpool->field_0x68 = cpool->field_0x68 & 0xfe | 1;
    }
    pipe_st._152_8_ = cpool_get_first(cpool);
    while (pipe_st._152_8_ != 0) {
      cpool_remove_conn(cpool,(connectdata *)pipe_st._152_8_);
      sigpipe_apply(cpool->idata,(sigpipe_ignore *)local_b8);
      Curl_conncontrol((connectdata *)pipe_st._152_8_,1);
      cpool_discard_conn(cpool,cpool->idata,(connectdata *)pipe_st._152_8_,false);
      pipe_st._152_8_ = cpool_get_first(cpool);
    }
    if (((cpool != (cpool *)0x0) &&
        (cpool->field_0x68 = cpool->field_0x68 & 0xfe, cpool->share != (Curl_share *)0x0)) &&
       ((cpool->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(cpool->idata,CURL_LOCK_DATA_CONNECT);
    }
    sigpipe_restore((sigpipe_ignore *)local_b8);
    Curl_hash_destroy(&cpool->dest2bundle);
  }
  return;
}

Assistant:

void Curl_cpool_destroy(struct cpool *cpool)
{
  if(cpool && cpool->initialised && cpool->idata) {
    struct connectdata *conn;
    SIGPIPE_VARIABLE(pipe_st);

    CURL_TRC_M(cpool->idata, "%s[CPOOL] destroy, %zu connections",
               cpool->share ? "[SHARE] " : "", cpool->num_conn);
    /* Move all connections to the shutdown list */
    sigpipe_init(&pipe_st);
    CPOOL_LOCK(cpool, cpool->idata);
    conn = cpool_get_first(cpool);
    while(conn) {
      cpool_remove_conn(cpool, conn);
      sigpipe_apply(cpool->idata, &pipe_st);
      connclose(conn, "kill all");
      cpool_discard_conn(cpool, cpool->idata, conn, FALSE);
      conn = cpool_get_first(cpool);
    }
    CPOOL_UNLOCK(cpool, cpool->idata);
    sigpipe_restore(&pipe_st);
    Curl_hash_destroy(&cpool->dest2bundle);
  }
}